

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O3

Regexp * __thiscall
duckdb_re2::SimplifyWalker::PostVisit
          (SimplifyWalker *this,Regexp *re,Regexp *parent_arg,Regexp *pre_arg,Regexp **child_args,
          int nchild_args)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar4;
  Regexp *pRVar5;
  Regexp *pRVar6;
  ulong uVar7;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  bVar1 = re->op_;
  switch(bVar1) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x15:
    goto switchD_011dc194_caseD_1;
  case 5:
  case 6:
    bVar3 = ChildArgsChanged(re,child_args);
    if (bVar3) {
      pRVar6 = (Regexp *)operator_new(0x28);
      Regexp::Regexp(pRVar6,(uint)re->op_,(uint)re->parse_flags_);
      uVar2 = re->nsub_;
      if ((ulong)uVar2 < 2) {
        pRVar6->nsub_ = uVar2;
        if (uVar2 == 0) goto LAB_011dc391;
        paVar4 = &pRVar6->field_5;
      }
      else {
        paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)operator_new__((ulong)((uint)uVar2 * 8));
        (pRVar6->field_5).submany_ = (Regexp **)paVar4;
        pRVar6->nsub_ = uVar2;
      }
      uVar7 = 0;
      do {
        paVar4[uVar7] = *(anon_union_8_2_3df47e5c_for_Regexp_7 *)(child_args + uVar7);
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
LAB_011dc391:
      pRVar6->simple_ = '\x01';
      return pRVar6;
    }
    goto switchD_011dc194_caseD_1;
  case 7:
  case 8:
  case 9:
    pRVar5 = *child_args;
    if (pRVar5->op_ == 2) {
      return pRVar5;
    }
    if (re->nsub_ < 2) {
      paVar4 = &re->field_5;
    }
    else {
      paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
    }
    if (pRVar5 != (Regexp *)paVar4->submany_) {
      if ((bVar1 == pRVar5->op_) && (re->parse_flags_ == pRVar5->parse_flags_)) {
        return pRVar5;
      }
      pRVar6 = (Regexp *)operator_new(0x28);
      Regexp::Regexp(pRVar6,(uint)bVar1,(uint)re->parse_flags_);
      pRVar6->nsub_ = 1;
      (pRVar6->field_5).subone_ = pRVar5;
      goto LAB_011dc391;
    }
    break;
  case 10:
    pRVar5 = *child_args;
    if (pRVar5->op_ == '\x02') {
      return pRVar5;
    }
    pRVar6 = SimplifyRepeat(pRVar5,(re->arguments).repeat.min_,(re->arguments).repeat.max_,
                            (uint)re->parse_flags_);
    Regexp::Decref(pRVar5);
    pRVar6->simple_ = '\x01';
    return pRVar6;
  case 0xb:
    pRVar5 = *child_args;
    if (re->nsub_ < 2) {
      paVar4 = &re->field_5;
    }
    else {
      paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
    }
    if (pRVar5 != (Regexp *)paVar4->submany_) {
      pRVar6 = (Regexp *)operator_new(0x28);
      Regexp::Regexp(pRVar6,kRegexpCapture,(uint)re->parse_flags_);
      pRVar6->nsub_ = 1;
      (pRVar6->field_5).subone_ = pRVar5;
      (pRVar6->arguments).repeat.max_ = (re->arguments).repeat.max_;
      goto LAB_011dc391;
    }
    break;
  case 0x14:
    pRVar5 = SimplifyCharClass(re);
    pRVar5->simple_ = '\x01';
    return pRVar5;
  default:
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Simplify case not handled: ",0x1b);
    std::ostream::operator<<(local_198,(uint)re->op_);
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::ios_base::~ios_base(local_128);
    pRVar5 = Regexp::Incref(re);
    return pRVar5;
  }
  Regexp::Decref(pRVar5);
switchD_011dc194_caseD_1:
  re->simple_ = '\x01';
  pRVar5 = Regexp::Incref(re);
  return pRVar5;
}

Assistant:

Regexp* SimplifyWalker::PostVisit(Regexp* re,
                                  Regexp* parent_arg,
                                  Regexp* pre_arg,
                                  Regexp** child_args,
                                  int nchild_args) {
  switch (re->op()) {
    case kRegexpNoMatch:
    case kRegexpEmptyMatch:
    case kRegexpLiteral:
    case kRegexpLiteralString:
    case kRegexpBeginLine:
    case kRegexpEndLine:
    case kRegexpBeginText:
    case kRegexpWordBoundary:
    case kRegexpNoWordBoundary:
    case kRegexpEndText:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
    case kRegexpHaveMatch:
      // All these are always simple.
      re->simple_ = true;
      return re->Incref();

    case kRegexpConcat:
    case kRegexpAlternate: {
      // These are simple as long as the subpieces are simple.
      if (!ChildArgsChanged(re, child_args)) {
        re->simple_ = true;
        return re->Incref();
      }
      Regexp* nre = new Regexp(re->op(), re->parse_flags());
      nre->AllocSub(re->nsub());
      Regexp** nre_subs = nre->sub();
      for (int i = 0; i < re->nsub(); i++)
        nre_subs[i] = child_args[i];
      nre->simple_ = true;
      return nre;
    }

    case kRegexpCapture: {
      Regexp* newsub = child_args[0];
      if (newsub == re->sub()[0]) {
        newsub->Decref();
        re->simple_ = true;
        return re->Incref();
      }
      Regexp* nre = new Regexp(kRegexpCapture, re->parse_flags());
      nre->AllocSub(1);
      nre->sub()[0] = newsub;
      nre->arguments.capture.cap_ = re->cap();
      nre->simple_ = true;
      return nre;
    }

    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest: {
      Regexp* newsub = child_args[0];
      // Special case: repeat the empty string as much as
      // you want, but it's still the empty string.
      if (newsub->op() == kRegexpEmptyMatch)
        return newsub;

      // These are simple as long as the subpiece is simple.
      if (newsub == re->sub()[0]) {
        newsub->Decref();
        re->simple_ = true;
        return re->Incref();
      }

      // These are also idempotent if flags are constant.
      if (re->op() == newsub->op() &&
          re->parse_flags() == newsub->parse_flags())
        return newsub;

      Regexp* nre = new Regexp(re->op(), re->parse_flags());
      nre->AllocSub(1);
      nre->sub()[0] = newsub;
      nre->simple_ = true;
      return nre;
    }

    case kRegexpRepeat: {
      Regexp* newsub = child_args[0];
      // Special case: repeat the empty string as much as
      // you want, but it's still the empty string.
      if (newsub->op() == kRegexpEmptyMatch)
        return newsub;

      Regexp* nre = SimplifyRepeat(newsub, re->arguments.repeat.min_, re->arguments.repeat.max_,
                                   re->parse_flags());
      newsub->Decref();
      nre->simple_ = true;
      return nre;
    }

    case kRegexpCharClass: {
      Regexp* nre = SimplifyCharClass(re);
      nre->simple_ = true;
      return nre;
    }
  }

  LOG(ERROR) << "Simplify case not handled: " << re->op();
  return re->Incref();
}